

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.cpp
# Opt level: O2

void __thiscall Refal2::CScanner::warning(CScanner *this,TWarning warning,char c)

{
  int line;
  int position;
  ostream *poVar1;
  char *pcVar2;
  string local_1b8;
  ostringstream warningStream;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&warningStream);
  if (warning == W_SymbolAfterPlus) {
    poVar1 = std::operator<<((ostream *)&warningStream,"unuseful symbol `");
    poVar1 = std::operator<<(poVar1,c);
    pcVar2 = "` after plus";
  }
  else {
    if (warning != W_Semicolon) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Scanner.cpp"
                    ,0xa2,"void Refal2::CScanner::warning(TWarning, char)");
    }
    poVar1 = std::operator<<((ostream *)&warningStream,"using `");
    poVar1 = std::operator<<(poVar1,c);
    pcVar2 = "` as line feed is obsolete";
  }
  std::operator<<(poVar1,pcVar2);
  line = this->line;
  position = this->position;
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_1b8,'\x01');
  CError::SetTokenData((CError *)this,line,position,&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::stringbuf::str();
  CErrorsHelper::RaiseError((CErrorsHelper *)this,ES_Warning,&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  CError::ResetToken((CError *)this);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&warningStream);
  return;
}

Assistant:

void CScanner::warning( TWarning warning, char c )
{
	std::ostringstream warningStream;
	switch( warning ) {
		case W_Semicolon:
			warningStream << "using `" << c << "` as line feed is obsolete";
			break;
		case W_SymbolAfterPlus:
			warningStream << "unuseful symbol `" << c << "` after plus";
			break;
		default:
			assert( false );
			break;
	}
	CError::SetTokenData( line, position, std::string( 1, c ) );
	CErrorsHelper::RaiseError( ES_Warning, warningStream.str() );
	CError::ResetToken();
}